

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void BatchNorm(pBox *pbox,BN *beta,BN *mean,BN *var)

{
  int iVar1;
  int iVar2;
  mydataFmt *pmVar3;
  mydataFmt *pmVar4;
  mydataFmt *pmVar5;
  ostream *poVar6;
  float fVar7;
  double dVar8;
  int local_64;
  int local_60;
  int col;
  int channel;
  mydataFmt temp;
  long dis;
  float epsilon;
  int gamma;
  mydataFmt *bp;
  mydataFmt *mp;
  mydataFmt *vp;
  mydataFmt *pp;
  BN *var_local;
  BN *mean_local;
  BN *beta_local;
  pBox *pbox_local;
  
  if (pbox->pdata == (mydataFmt *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Relu feature is NULL!!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if (((var->pdata == (mydataFmt *)0x0) || (mean->pdata == (mydataFmt *)0x0)) ||
          (beta->pdata == (mydataFmt *)0x0)) {
    poVar6 = std::operator<<((ostream *)&std::cout,"the  BatchNorm bias is NULL!!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    vp = pbox->pdata;
    pmVar3 = var->pdata;
    pmVar4 = mean->pdata;
    pmVar5 = beta->pdata;
    iVar1 = pbox->width;
    iVar2 = pbox->height;
    for (local_60 = 0; local_60 < pbox->channel; local_60 = local_60 + 1) {
      dVar8 = std::sqrt((double)(ulong)(uint)(pmVar3[local_60] + 0.001));
      fVar7 = 1.0 / SUB84(dVar8,0);
      for (local_64 = 0; local_64 < iVar1 * iVar2; local_64 = local_64 + 1) {
        *vp = fVar7 * *vp + -fVar7 * pmVar4[local_60] + pmVar5[local_60];
        vp = vp + 1;
      }
    }
  }
  return;
}

Assistant:

void BatchNorm(struct pBox *pbox, struct BN *beta, struct BN *mean, struct BN *var) {
    if (pbox->pdata == NULL) {
        cout << "Relu feature is NULL!!" << endl;
        return;
    }
    if ((var->pdata == NULL) || (mean->pdata == NULL) || (beta->pdata == NULL)) {
        cout << "the  BatchNorm bias is NULL!!" << endl;
        return;
    }
    mydataFmt *pp = pbox->pdata;
    mydataFmt *vp = var->pdata;
    mydataFmt *mp = mean->pdata;
    mydataFmt *bp = beta->pdata;
    int gamma = 1;
    float epsilon = 0.001;
    long dis = pbox->width * pbox->height;
    mydataFmt temp = 0;
    for (int channel = 0; channel < pbox->channel; channel++) {
        temp = gamma / sqrt(((vp[channel]) + epsilon));
        for (int col = 0; col < dis; col++) {
            *pp = temp * (*pp) + ((bp[channel]) - temp * (mp[channel]));
            pp++;
        }
    }
}